

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_ffh_assert(lua_State *L)

{
  TValue *pTVar1;
  GCstr *pGVar2;
  
  pTVar1 = L->base;
  if (L->top <= pTVar1) {
    lj_err_arg(L,1,LJ_ERR_NOVAL);
  }
  if ((pTVar1 + 1 < L->top) && (*(int *)((long)pTVar1 + 0xc) != -1)) {
    pGVar2 = lj_lib_checkstr(L,2);
    if (pGVar2 != (GCstr *)0x0) {
      lj_err_callermsg(L,(char *)(pGVar2 + 1));
    }
  }
  lj_err_caller(L,LJ_ERR_ASSERT);
}

Assistant:

LJLIB_ASM(assert)		LJLIB_REC(.)
{
  GCstr *s;
  lj_lib_checkany(L, 1);
  s = lj_lib_optstr(L, 2);
  if (s)
    lj_err_callermsg(L, strdata(s));
  else
    lj_err_caller(L, LJ_ERR_ASSERT);
  return FFH_UNREACHABLE;
}